

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O3

Var __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,int offset,bool isFloat64,bool isInt32,
          JavascriptCallStackLayout *layout,FunctionBody *functionBody,bool boxValue)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int32 iVar4;
  undefined4 *puVar5;
  uint64 uVar6;
  uint64 uVar7;
  ScriptContext *scriptContext;
  FunctionInfo *pFVar8;
  int32 int32Value;
  Var instance;
  Var pvVar9;
  double value;
  
  if (offset < 0) {
    if (DAT_015bc46a == '\x01') {
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_0055ae91;
        *puVar5 = 0;
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId);
      if (bVar2) {
        Output::Print(L"Stack offset %10d",(ulong)(uint)offset);
      }
    }
    if (isFloat64) {
      value = Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
      Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      uVar6 = Js::NumberUtilities::ToSpecial(value);
      bVar2 = Js::NumberUtilities::IsNan(value);
      if (((bVar2) && (uVar7 = Js::NumberUtilities::ToSpecial(value), uVar7 != 0xfff8000000000000))
         && (uVar7 = Js::NumberUtilities::ToSpecial(value), uVar7 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                           ,0xa2,
                           "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                           ,"We should only produce a NaN with this value");
        if (!bVar2) goto LAB_0055ae91;
        *puVar5 = 0;
      }
      instance = (Var)(uVar6 ^ 0xfffc000000000000);
      if (DAT_015bc46a == '\x01') {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar8 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_0055ae91;
          *puVar5 = 0;
          pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId)
        ;
        if (bVar2) {
          Output::Print(L", value: %f (ToVar: 0x%p)",value,instance);
        }
      }
      goto LAB_0055ab39;
    }
    if (isInt32) {
      iVar4 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
      instance = (Var)(long)iVar4;
      goto LAB_0055ab41;
    }
    instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
LAB_0055ac2f:
    if (DAT_015bc46a == '\x01') {
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_0055ae91;
        *puVar5 = 0;
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId);
      if (bVar2) {
        Output::Print(L", value: 0x%p",instance);
      }
    }
    pvVar9 = instance;
    if (boxValue != false) {
      scriptContext = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pvVar9 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false);
      if ((instance != pvVar9) && (DAT_015bc46a == '\x01')) {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar8 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_0055ae91;
          *puVar5 = 0;
          pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId)
        ;
        if (bVar2) {
          Output::Print(L" (Boxed: 0x%p)",pvVar9);
        }
      }
    }
  }
  else {
    if (this->constantCount <= (uint)offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x14a,"(static_cast<uint>(offset) < constantCount)",
                         "static_cast<uint>(offset) < constantCount");
      if (!bVar2) goto LAB_0055ae91;
      *puVar5 = 0;
    }
    instance = this->constants[(uint)offset];
    boxValue = false;
LAB_0055ab39:
    if (!isInt32) goto LAB_0055ac2f;
LAB_0055ab41:
    Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    pvVar9 = (Var)((ulong)instance & 0xffffffff | 0x1000000000000);
    if (DAT_015bc46a == '\x01') {
      uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar8 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar2) goto LAB_0055ae91;
        *puVar5 = 0;
        pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId);
      if (bVar2) {
        Output::Print(L", value: %10d (ToVar: 0x%p)",(ulong)instance & 0xffffffff,pvVar9);
      }
    }
  }
  if (DAT_015bc46a == '\x01') {
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar8 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
LAB_0055ae91:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      pFVar8 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar3,pFVar8->functionId);
    if (bVar2) {
      Output::Print(L"\n");
    }
  }
  return pvVar9;
}

Assistant:

Js::Var InlineeFrameRecord::Restore(int offset, bool isFloat64, bool isInt32, Js::JavascriptCallStackLayout * layout, Js::FunctionBody* functionBody, bool boxValue) const
{
    Js::Var value;
    bool boxStackInstance = boxValue;
    double dblValue;
    if (offset >= 0)
    {
        Assert(static_cast<uint>(offset) < constantCount);
        value = this->constants[offset];
        boxStackInstance = false;
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Stack offset %10d"), offset);
        if (isFloat64)
        {
            dblValue = layout->GetDoubleAtOffset(offset);
            value = Js::JavascriptNumber::New(dblValue, functionBody->GetScriptContext());
            BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
        }
        else if (isInt32)
        {
            value = (Js::Var)layout->GetInt32AtOffset(offset);
        }
        else
        {
            value = layout->GetOffset(offset);
        }
    }

    if (isInt32)
    {
        int32 int32Value = ::Math::PointerCastToIntegralTruncate<int32>(value);
        value = Js::JavascriptNumber::ToVar(int32Value, functionBody->GetScriptContext());
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            // Do not deepCopy in this call to BoxStackInstance because this should be used for
            // bailing out, where a shallow copy that is cached is needed to ensure that multiple
            // vars pointing to the same boxed object reuse the new boxed value.
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, functionBody->GetScriptContext(), /* allowStackFunction */ true, false /* deepCopy */);

#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(functionBody, _u(" (Boxed: 0x%p)"), value);
            }
#endif
        }
    }
    BAILOUT_VERBOSE_TRACE(functionBody, _u("\n"));
    return value;
}